

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

Info * __thiscall CMU462::Halfedge::getInfo_abi_cxx11_(Halfedge *this)

{
  bool bVar1;
  ostream *poVar2;
  HalfedgeIter *pHVar3;
  Halfedge *pHVar4;
  VertexIter *pVVar5;
  Vertex *pVVar6;
  EdgeIter *pEVar7;
  Edge *pEVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  Face *__n;
  Halfedge *in_RSI;
  char *pcVar9;
  Info *in_RDI;
  ostringstream m8;
  ostringstream m7;
  ostringstream m6;
  ostringstream m5;
  ostringstream m4;
  ostringstream m3;
  ostringstream m2;
  ostringstream m1;
  Info *info;
  value_type *in_stack_fffffffffffff1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff1d0;
  string *this_01;
  string *this_02;
  string local_d70 [32];
  string local_d50 [32];
  string local_d30 [32];
  string local_d10 [32];
  string local_cf0 [32];
  string local_cd0 [32];
  string local_cb0 [32];
  string local_c90 [32];
  string local_c70 [32];
  string local_c50 [32];
  string local_c30 [32];
  pointer local_c10;
  _List_node_base *local_c08;
  _List_node_base *local_c00;
  _List_node_base *local_bf8;
  _List_node_base *local_bf0;
  ostringstream local_be8 [376];
  ostringstream local_a70 [376];
  ostringstream local_8f8 [376];
  ostringstream local_780 [376];
  ostringstream local_608 [376];
  ostringstream local_490 [376];
  ostringstream local_318 [392];
  ostringstream local_190 [383];
  byte local_11;
  
  local_11 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x233db7);
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_318);
  std::__cxx11::ostringstream::ostringstream(local_490);
  std::__cxx11::ostringstream::ostringstream(local_608);
  std::__cxx11::ostringstream::ostringstream(local_780);
  std::__cxx11::ostringstream::ostringstream(local_8f8);
  std::__cxx11::ostringstream::ostringstream(local_a70);
  std::__cxx11::ostringstream::ostringstream(local_be8);
  std::operator<<((ostream *)local_190,"HALFEDGE");
  poVar2 = std::operator<<((ostream *)local_318,"Address: ");
  std::ostream::operator<<(poVar2,in_RSI);
  poVar2 = std::operator<<((ostream *)local_490,"Twin: ");
  pHVar3 = twin(in_RSI);
  local_bf0 = pHVar3->_M_node;
  pHVar4 = elementAddress((HalfedgeIter)0x233ecf);
  std::ostream::operator<<(poVar2,pHVar4);
  poVar2 = std::operator<<((ostream *)local_608,"Next: ");
  pHVar3 = next(in_RSI);
  local_bf8 = pHVar3->_M_node;
  pHVar4 = elementAddress((HalfedgeIter)0x233f45);
  std::ostream::operator<<(poVar2,pHVar4);
  poVar2 = std::operator<<((ostream *)local_780,"Vertex: ");
  pVVar5 = vertex(in_RSI);
  local_c00 = pVVar5->_M_node;
  pVVar6 = elementAddress((VertexIter)0x233fac);
  std::ostream::operator<<(poVar2,pVVar6);
  poVar2 = std::operator<<((ostream *)local_8f8,"Edge: ");
  pEVar7 = edge(in_RSI);
  local_c08 = pEVar7->_M_node;
  pEVar8 = elementAddress((EdgeIter)0x234010);
  std::ostream::operator<<(poVar2,pEVar8);
  poVar2 = std::operator<<((ostream *)local_a70,"Face: ");
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)face(in_RSI);
  local_c10 = (this_00->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  __n = elementAddress((FaceIter)0x234074);
  std::ostream::operator<<(poVar2,__n);
  poVar2 = std::operator<<((ostream *)local_be8,"Boundary: ");
  bVar1 = isBoundary((Halfedge *)0x2340b4);
  pcVar9 = "NO";
  if (bVar1) {
    pcVar9 = "YES";
  }
  std::operator<<(poVar2,pcVar9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(this_00,(size_type)__n);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
  std::__cxx11::string::~string(local_c30);
  this_02 = local_c50;
  std::__cxx11::string::string(this_02);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
  std::__cxx11::string::~string(local_c50);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
  std::__cxx11::string::~string(local_c70);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
  std::__cxx11::string::~string(local_c90);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
  std::__cxx11::string::~string(local_cb0);
  std::__cxx11::string::string(local_cd0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
  std::__cxx11::string::~string(local_cd0);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
  std::__cxx11::string::~string(local_cf0);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
  std::__cxx11::string::~string(local_d10);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
  std::__cxx11::string::~string(local_d30);
  this_01 = local_d50;
  std::__cxx11::string::string(this_01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_01,in_stack_fffffffffffff1c8);
  std::__cxx11::string::~string(local_d50);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_01,in_stack_fffffffffffff1c8);
  std::__cxx11::string::~string(local_d70);
  local_11 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_be8);
  std::__cxx11::ostringstream::~ostringstream(local_a70);
  std::__cxx11::ostringstream::~ostringstream(local_8f8);
  std::__cxx11::ostringstream::~ostringstream(local_780);
  std::__cxx11::ostringstream::~ostringstream(local_608);
  std::__cxx11::ostringstream::~ostringstream(local_490);
  std::__cxx11::ostringstream::~ostringstream(local_318);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  if ((local_11 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_02);
  }
  return in_RDI;
}

Assistant:

Info Halfedge::getInfo() {
  Info info;

  ostringstream m1, m2, m3, m4, m5, m6, m7, m8;
  m1 << "HALFEDGE";
  m2 << "Address: " << this;
  m3 << "Twin: " << elementAddress(twin());
  m4 << "Next: " << elementAddress(next());
  m5 << "Vertex: " << elementAddress(vertex());
  m6 << "Edge: " << elementAddress(edge());
  m7 << "Face: " << elementAddress(face());
  m8 << "Boundary: " << (isBoundary() ? "YES" : "NO");

  info.reserve(8);
  info.push_back(m1.str());
  info.push_back(string());
  info.push_back(m2.str());
  info.push_back(m3.str());
  info.push_back(m4.str());
  info.push_back(string());
  info.push_back(m5.str());
  info.push_back(m6.str());
  info.push_back(m7.str());
  info.push_back(string());
  info.push_back(m8.str());

  return info;
}